

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeElementUnits
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t length)

{
  char16_t *pcVar1;
  ssize_t sVar2;
  UnicodeString local_60;
  uint local_1c;
  int32_t local_18;
  int32_t length_local;
  int32_t unitIndex_local;
  int32_t i_local;
  UCharsTrieBuilder *this_local;
  
  local_1c = length;
  local_18 = unitIndex;
  length_local = i;
  _unitIndex_local = this;
  UCharsTrieElement::getString(&local_60,this->elements + i,&this->strings);
  pcVar1 = UnicodeString::getBuffer(&local_60);
  sVar2 = write(this,(int)pcVar1 + local_18 * 2,(void *)(ulong)local_1c,(long)local_18);
  UnicodeString::~UnicodeString(&local_60);
  return (int32_t)sVar2;
}

Assistant:

int32_t
UCharsTrieBuilder::writeElementUnits(int32_t i, int32_t unitIndex, int32_t length) {
    return write(elements[i].getString(strings).getBuffer()+unitIndex, length);
}